

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O2

iterator * __thiscall
csv::CSVRow::iterator::operator--(iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  iterator(__return_storage_ptr__,this);
  operator--(this);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVRow::iterator CSVRow::iterator::operator--(int) {
        // Post-decrement operator
        auto temp = *this;
        this->operator--();
        return temp;
    }